

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadSource(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string sourceID;
  allocator local_71;
  string local_70;
  string local_50;
  
  uVar2 = GetAttribute(this,"id");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
  std::__cxx11::string::string
            ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar3),(allocator *)&local_70);
LAB_003e8108:
  do {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar3 == '\0') {
LAB_003e81ec:
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      bVar1 = IsElement(this,"float_array");
      if (!bVar1) {
        bVar1 = IsElement(this,"IDREF_array");
        if (!bVar1) {
          bVar1 = IsElement(this,"Name_array");
          if (!bVar1) {
            bVar1 = IsElement(this,"technique_common");
            if (!bVar1) {
              bVar1 = IsElement(this,"accessor");
              if (bVar1) {
                ReadAccessor(this,&local_50);
              }
              else {
                SkipElement(this);
              }
            }
            goto LAB_003e8108;
          }
        }
      }
      ReadDataArray(this);
      goto LAB_003e8108;
    }
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 2) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"source");
      if (iVar3 == 0) goto LAB_003e81ec;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"technique_common");
      if (iVar3 != 0) {
        std::__cxx11::string::string
                  ((string *)&local_70,"Expected end of <source> element.",&local_71);
        ThrowException(this,&local_70);
      }
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadSource()
{
    int indexID = GetAttribute("id");
    std::string sourceID = mReader->getAttributeValue(indexID);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("float_array") || IsElement("IDREF_array") || IsElement("Name_array"))
            {
                ReadDataArray();
            }
            else if (IsElement("technique_common"))
            {
                // I don't care for your profiles
            }
            else if (IsElement("accessor"))
            {
                ReadAccessor(sourceID);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "source") == 0)
            {
                // end of <source> - we're done
                break;
            }
            else if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <source> element.");
            }
        }
    }
}